

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void * hash_table_delete_item(hash_table_t *table,void *key)

{
  size_t sVar1;
  int iVar2;
  size_t sVar3;
  hash_table_bucket_t *phVar4;
  hash_table_bucket_t *c;
  hash_table_bucket_t **b;
  uint i;
  void *key_local;
  hash_table_t *table_local;
  
  sVar1 = (table->ghash).mult;
  sVar3 = (*table->hash)(key);
  phVar4 = table->buckets +
           (sVar1 * sVar3 + (table->ghash).add >> (0x40U - (char)(table->ghash).log2_buckets & 0x3f)
           & 0xffffffff);
  while( true ) {
    c = (hash_table_bucket_t *)&phVar4->next;
    if (c->data == (void *)0x0) {
      return (void *)0x0;
    }
    iVar2 = (*table->is_equal)(key,*c->data);
    if (iVar2 != 0) break;
    phVar4 = (hash_table_bucket_t *)c->data;
  }
  phVar4 = (hash_table_bucket_t *)c->data;
  c->data = *(void **)((long)c->data + 8);
  table->n_items = table->n_items - 1;
  phVar4->next = table->free_buckets;
  table->free_buckets = phVar4;
  return phVar4->data;
}

Assistant:

void * hash_table_delete_item( hash_table_t * table, void * key )
{
    unsigned i = (unsigned) hash( table->ghash, (* table->hash )( key ) );
    hash_table_bucket_t **b = & table->buckets[i].next;
   
    while (*b) {
        if ( (*table->is_equal)(key, (*b)->data) )
        {
            hash_table_bucket_t * c = *b;
            *b = (*b)->next;
            table->n_items -= 1;
            c->next = table->free_buckets;
            table->free_buckets = c;
            return c->data;
        }
        b = &(*b)->next;
    }
    return NULL;
}